

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_packed.h
# Opt level: O1

void ncnn::convolution_transform_kernel_packed
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  undefined1 (*pauVar9) [64];
  undefined1 (*pauVar10) [64];
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  void *pvVar18;
  void *pvVar19;
  int iVar20;
  uint uVar21;
  uint *puVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  void *pvVar31;
  long lVar32;
  void *pvVar33;
  ulong uVar34;
  uint *puVar35;
  int iVar36;
  float *k0_2;
  void *pvVar37;
  ulong uVar38;
  void *pvVar39;
  int iVar40;
  void *pvVar41;
  void *pvVar42;
  void *pvVar43;
  long lVar44;
  void *pvVar45;
  long lVar46;
  uint *puVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar75 [32];
  undefined1 in_ZMM4 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar76 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar77 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar78 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  void *local_110;
  void *local_100;
  void *local_f8;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  int local_a8;
  int local_a4;
  ulong uVar22;
  
  uVar21 = kernel_w * kernel_h;
  uVar22 = (ulong)uVar21;
  iVar15 = inch;
  if (outch < 0x10) {
    if (outch < 8) {
      if (outch < 4) {
        if (outch < 2) {
          iVar11 = outch;
          if (inch < 0x10) {
            if (inch < 8) {
              if (inch < 4) {
                uVar24 = uVar21;
                if (1 < inch) {
                  uVar24 = uVar21 * 2;
                  iVar15 = (inch & 1U) + 1;
                }
              }
              else {
                uVar24 = uVar21 * 4;
                iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
              }
            }
            else {
              uVar24 = uVar21 * 8;
              iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
            }
          }
          else {
            uVar24 = uVar21 * 0x10;
            iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
                     ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
          }
        }
        else {
          if (inch < 0x10) {
            if (inch < 8) {
              if (inch < 4) {
                if (inch < 2) {
                  uVar24 = uVar21 * 2;
                  iVar11 = (outch & 1U) + 1;
                  goto LAB_001886d9;
                }
                uVar24 = uVar21 * 4;
                iVar15 = (inch & 1U) + 1;
              }
              else {
                iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
                uVar24 = uVar21 * 8;
              }
            }
            else {
              uVar24 = uVar21 * 0x10;
              iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
            }
          }
          else {
            uVar24 = uVar21 * 0x20;
            iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
                     ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
          }
          iVar11 = (outch & 1U) + 1;
        }
      }
      else {
        if (inch < 0x10) {
          if (inch < 8) {
            if (inch < 4) {
              if (inch < 2) {
                uVar24 = uVar21 * 4;
                iVar11 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
                goto LAB_001886d9;
              }
              uVar24 = uVar21 * 8;
              iVar15 = (inch & 1U) + 1;
            }
            else {
              uVar24 = uVar21 * 0x10;
              iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
            }
          }
          else {
            uVar24 = uVar21 * 0x20;
            iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
          }
        }
        else {
          uVar24 = uVar21 * 0x40;
          iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
                   ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
        }
        iVar11 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
      }
    }
    else {
      if (inch < 0x10) {
        if (inch < 8) {
          if (inch < 4) {
            if (inch < 2) {
              uVar24 = uVar21 * 8;
              iVar11 = (outch & 1U) + 1 + ((uint)outch >> 2 & 1) +
                       (uint)(((uint)outch >> 1 & 1) != 0);
              goto LAB_001886d9;
            }
            uVar24 = uVar21 * 0x10;
            iVar15 = (inch & 1U) + 1;
          }
          else {
            uVar24 = uVar21 * 0x20;
            iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
          }
        }
        else {
          uVar24 = uVar21 * 0x40;
          iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
        }
      }
      else {
        uVar24 = uVar21 * 0x80;
        iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
                 ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
      }
      iVar11 = (outch & 1U) + 1 + ((uint)outch >> 2 & 1) + (uint)(((uint)outch >> 1 & 1) != 0);
    }
  }
  else {
    if (inch < 0x10) {
      if (inch < 8) {
        if (inch < 4) {
          if (inch < 2) {
            uVar24 = uVar21 * 0x10;
            iVar11 = (outch & 1U) + ((uint)outch >> 4) + (uint)(((uint)outch >> 3 & 1) != 0) +
                     ((uint)outch >> 2 & 1) + (uint)(((uint)outch >> 1 & 1) != 0);
            goto LAB_001886d9;
          }
          uVar24 = uVar21 * 0x20;
          iVar15 = (inch & 1U) + 1;
        }
        else {
          uVar24 = uVar21 * 0x40;
          iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
        }
      }
      else {
        uVar24 = uVar21 * 0x80;
        iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
      }
    }
    else {
      uVar24 = uVar21 * 0x100;
      iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
               ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
    }
    iVar11 = (outch & 1U) + ((uint)outch >> 4) + (uint)(((uint)outch >> 3 & 1) != 0) +
             ((uint)outch >> 2 & 1) + (uint)(((uint)outch >> 1 & 1) != 0);
  }
LAB_001886d9:
  Mat::create(kernel_tm,uVar24,iVar15,iVar11,4,(Allocator *)0x0);
  uVar27 = 0;
  if (0xf < outch) {
    iVar12 = uVar21 * inch;
    auVar51 = vpbroadcastd_avx512f();
    auVar52 = vpbroadcastd_avx512f();
    auVar1 = vpmulld_avx(auVar52._0_16_,auVar51._0_16_);
    auVar50._0_4_ = auVar1._0_4_;
    auVar50._4_4_ = auVar50._0_4_;
    auVar50._8_4_ = auVar50._0_4_;
    auVar50._12_4_ = auVar50._0_4_;
    auVar50._16_4_ = auVar50._0_4_;
    auVar50._20_4_ = auVar50._0_4_;
    auVar50._24_4_ = auVar50._0_4_;
    auVar50._28_4_ = auVar50._0_4_;
    auVar52 = vpmulld_avx512f(auVar52,_DAT_005f2fc0);
    vpmulld_avx512f(auVar52,auVar51);
    lVar17 = (long)(int)(uVar21 * 0x10) * 4;
    iVar15 = iVar12 * 7;
    iVar8 = iVar12 * 0x10;
    iVar26 = iVar12 * 2;
    iVar11 = iVar12 * 6;
    iVar30 = iVar12 * 5;
    iVar36 = iVar12 * 4;
    lVar25 = (long)(int)uVar21 * 4;
    auVar75 = vpmovsxbd_avx2(ZEXT816(0x8090a0b0c0d0e0f));
    in_ZMM3 = ZEXT3264(auVar75);
    local_a4 = iVar12 * 3;
    iVar13 = 0;
    uVar38 = 0;
    local_a8 = iVar12;
    do {
      pauVar9 = (undefined1 (*) [64])
                ((uVar38 >> 4) * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
      pvVar37 = kernel->data;
      if (inch < 0x10) {
        pvVar37 = (void *)((long)pvVar37 + (long)(iVar12 * (int)uVar38) * 4);
        uVar24 = 0;
      }
      else {
        auVar49 = vpbroadcastd_avx512vl();
        auVar49 = vpor_avx2(auVar49,auVar75);
        auVar49 = vpmulld_avx2(auVar50,auVar49);
        local_e8 = (void *)((long)pvVar37 + (long)auVar49._0_4_ * 4);
        local_110 = (void *)((long)pvVar37 + (long)auVar49._4_4_ * 4);
        pvVar19 = (void *)((long)pvVar37 + (long)auVar49._8_4_ * 4);
        pvVar45 = (void *)((long)pvVar37 + (long)auVar49._12_4_ * 4);
        in_ZMM4 = ZEXT1664(auVar49._16_16_);
        pvVar43 = (void *)((long)pvVar37 + (long)auVar49._16_4_ * 4);
        local_100 = (void *)((long)pvVar37 + (long)auVar49._20_4_ * 4);
        local_d8 = (void *)((long)pvVar37 + (long)auVar49._24_4_ * 4);
        local_e0 = (void *)((long)pvVar37 + (long)auVar49._28_4_ * 4);
        pvVar42 = (void *)((long)iVar15 * 4 + (long)pvVar37);
        pvVar31 = (void *)((long)iVar11 * 4 + (long)pvVar37);
        pvVar18 = (void *)((long)iVar30 * 4 + (long)pvVar37);
        pvVar33 = (void *)((long)iVar36 * 4 + (long)pvVar37);
        pvVar39 = (void *)((long)local_a4 * 4 + (long)pvVar37);
        local_f8 = (void *)((long)iVar26 * 4 + (long)pvVar37);
        pvVar41 = (void *)((long)local_a8 * 4 + (long)pvVar37);
        pvVar37 = (void *)((long)iVar13 * 4 + (long)pvVar37);
        iVar40 = 0;
        do {
          if (0 < (int)uVar21) {
            lVar44 = 0;
            do {
              auVar51 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar37 + (long)local_110 * 4 + lVar44));
              auVar52 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar41 + (long)local_110 * 4 + lVar44));
              auVar53 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)local_f8 + (long)local_110 * 4 + lVar44));
              auVar54 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar39 + (long)local_110 * 4 + lVar44));
              auVar55 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar33 + (long)local_110 * 4 + lVar44));
              auVar56 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar18 + (long)local_110 * 4 + lVar44));
              auVar57 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar31 + (long)local_110 * 4 + lVar44));
              auVar58 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar42 + (long)local_110 * 4 + lVar44));
              auVar59 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)local_e0 + (long)local_110 * 4 + lVar44));
              auVar60 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)local_d8 + (long)local_110 * 4 + lVar44));
              auVar61 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)local_100 + (long)local_110 * 4 + lVar44));
              auVar62 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar43 + (long)local_110 * 4 + lVar44));
              vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              auVar63 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar45 + (long)local_110 * 4 + lVar44));
              vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              auVar64 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar19 + (long)local_110 * 4 + lVar44));
              vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              auVar65 = vgatherdps_avx512f(*(undefined4 *)((long)local_110 * 5 + lVar44));
              vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              auVar66 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)local_e8 + (long)local_110 * 4 + lVar44));
              auVar67 = vunpcklps_avx512f(auVar51,auVar52);
              auVar51 = vunpckhps_avx512f(auVar51,auVar52);
              auVar52 = vunpcklps_avx512f(auVar53,auVar54);
              auVar53 = vunpckhps_avx512f(auVar53,auVar54);
              auVar54 = vunpcklps_avx512f(auVar55,auVar56);
              auVar55 = vunpckhps_avx512f(auVar55,auVar56);
              auVar56 = vunpcklps_avx512f(auVar57,auVar58);
              auVar57 = vunpckhps_avx512f(auVar57,auVar58);
              auVar58 = vunpcklps_avx512f(auVar59,auVar60);
              auVar59 = vunpckhps_avx512f(auVar59,auVar60);
              auVar60 = vunpcklps_avx512f(auVar61,auVar62);
              auVar61 = vunpckhps_avx512f(auVar61,auVar62);
              auVar62 = vunpcklps_avx512f(auVar63,auVar64);
              auVar63 = vunpckhps_avx512f(auVar63,auVar64);
              auVar64 = vunpcklps_avx512f(auVar65,auVar66);
              auVar65 = vunpckhps_avx512f(auVar65,auVar66);
              auVar66 = vunpcklpd_avx512f(auVar67,auVar52);
              auVar52 = vunpckhpd_avx512f(auVar67,auVar52);
              auVar67 = vunpcklpd_avx512f(auVar51,auVar53);
              auVar51 = vunpckhpd_avx512f(auVar51,auVar53);
              auVar53 = vunpcklpd_avx512f(auVar54,auVar56);
              auVar54 = vunpckhpd_avx512f(auVar54,auVar56);
              auVar56 = vunpcklpd_avx512f(auVar55,auVar57);
              auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
              auVar57 = vunpcklpd_avx512f(auVar58,auVar60);
              auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
              auVar60 = vunpcklpd_avx512f(auVar59,auVar61);
              auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
              auVar61 = vunpcklpd_avx512f(auVar62,auVar64);
              auVar62 = vunpckhpd_avx512f(auVar62,auVar64);
              auVar64 = vunpcklpd_avx512f(auVar63,auVar65);
              auVar63 = vunpckhpd_avx512f(auVar63,auVar65);
              auVar65 = vshuff64x2_avx512f(auVar66,auVar53,0x88);
              auVar68 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
              auVar69 = vshuff64x2_avx512f(auVar52,auVar54,0x88);
              auVar70 = vshuff64x2_avx512f(auVar58,auVar62,0x88);
              auVar71 = vshuff64x2_avx512f(auVar67,auVar56,0x88);
              auVar72 = vshuff64x2_avx512f(auVar60,auVar64,0x88);
              auVar73 = vshuff64x2_avx512f(auVar51,auVar55,0x88);
              auVar74 = vshuff64x2_avx512f(auVar59,auVar63,0x88);
              auVar53 = vshuff64x2_avx512f(auVar66,auVar53,0xdd);
              auVar57 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
              auVar52 = vshuff64x2_avx512f(auVar52,auVar54,0xdd);
              auVar54 = vshuff64x2_avx512f(auVar58,auVar62,0xdd);
              auVar56 = vshuff64x2_avx512f(auVar67,auVar56,0xdd);
              auVar58 = vshuff64x2_avx512f(auVar60,auVar64,0xdd);
              auVar51 = vshuff64x2_avx512f(auVar51,auVar55,0xdd);
              in_ZMM8 = vshuff64x2_avx512f(auVar59,auVar63,0xdd);
              auVar55 = vshuff64x2_avx512f(auVar65,auVar68,0x88);
              auVar59 = vshuff64x2_avx512f(auVar69,auVar70,0x88);
              auVar60 = vshuff64x2_avx512f(auVar71,auVar72,0x88);
              auVar61 = vshuff64x2_avx512f(auVar73,auVar74,0x88);
              in_ZMM16 = vshuff64x2_avx512f(auVar53,auVar57,0x88);
              in_ZMM17 = vshuff64x2_avx512f(auVar52,auVar54,0x88);
              in_ZMM19 = vshuff64x2_avx512f(auVar56,auVar58,0x88);
              auVar62 = vshuff64x2_avx512f(auVar51,in_ZMM8,0x88);
              in_ZMM18 = vshuff64x2_avx512f(auVar65,auVar68,0xdd);
              auVar63 = vshuff64x2_avx512f(auVar69,auVar70,0xdd);
              auVar64 = vshuff64x2_avx512f(auVar71,auVar72,0xdd);
              auVar65 = vshuff64x2_avx512f(auVar73,auVar74,0xdd);
              in_ZMM6 = vshuff64x2_avx512f(auVar53,auVar57,0xdd);
              in_ZMM5 = vshuff64x2_avx512f(auVar52,auVar54,0xdd);
              in_ZMM7 = vshuff64x2_avx512f(auVar56,auVar58,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(auVar51,in_ZMM8,0xdd);
              *pauVar9 = auVar55;
              pauVar9[1] = auVar59;
              pauVar9[2] = auVar60;
              pauVar9[3] = auVar61;
              pauVar9[4] = in_ZMM16;
              pauVar9[5] = in_ZMM17;
              pauVar9[6] = in_ZMM19;
              pauVar9[7] = auVar62;
              pauVar9[8] = in_ZMM18;
              pauVar9[9] = auVar63;
              pauVar9[10] = auVar64;
              pauVar9[0xb] = auVar65;
              pauVar9[0xc] = in_ZMM6;
              pauVar9[0xd] = in_ZMM5;
              pauVar9[0xe] = in_ZMM7;
              pauVar9[0xf] = in_ZMM4;
              pauVar9 = pauVar9 + 0x10;
              lVar44 = lVar44 + 4;
            } while (uVar22 * 4 != lVar44);
          }
          pvVar37 = (void *)((long)pvVar37 + lVar17);
          iVar20 = iVar40 + 0x1f;
          local_e8 = (void *)((long)local_e8 + lVar17);
          local_110 = (void *)((long)local_110 + lVar17);
          pvVar19 = (void *)((long)pvVar19 + lVar17);
          pvVar45 = (void *)((long)pvVar45 + lVar17);
          pvVar43 = (void *)((long)pvVar43 + lVar17);
          local_100 = (void *)((long)local_100 + lVar17);
          local_d8 = (void *)((long)local_d8 + lVar17);
          local_e0 = (void *)((long)local_e0 + lVar17);
          pvVar42 = (void *)((long)pvVar42 + lVar17);
          pvVar31 = (void *)((long)pvVar31 + lVar17);
          pvVar18 = (void *)((long)pvVar18 + lVar17);
          pvVar33 = (void *)((long)pvVar33 + lVar17);
          pvVar39 = (void *)((long)pvVar39 + lVar17);
          local_f8 = (void *)((long)local_f8 + lVar17);
          pvVar41 = (void *)((long)pvVar41 + lVar17);
          uVar24 = inch & 0xfffffff0;
          iVar40 = iVar40 + 0x10;
        } while (iVar20 < inch);
      }
      uVar16 = uVar24 | 7;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          uVar27 = 0;
          pvVar19 = pvVar37;
          do {
            pauVar10 = pauVar9;
            pvVar45 = pvVar19;
            lVar44 = 0;
            do {
              lVar29 = lVar44;
              in_ZMM4 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar45 + (long)pvVar19 * 4));
              *(undefined1 (*) [64])((long)*pauVar10 + lVar29) = in_ZMM4;
              pvVar45 = (void *)((long)pvVar45 + lVar25);
              lVar44 = lVar29 + 0x40;
            } while ((int)(lVar29 + 0x40) != 0x200);
            uVar27 = uVar27 + 1;
            pvVar19 = (void *)((long)pvVar19 + 4);
            pauVar9 = (undefined1 (*) [64])(pauVar10[1] + lVar29);
          } while (uVar27 != uVar22);
          pauVar9 = (undefined1 (*) [64])(pauVar10[1] + lVar29);
        }
        pvVar37 = (void *)((long)pvVar37 + (long)(int)(uVar21 * 8) * 4);
        uVar16 = uVar24 + 0xf;
        uVar24 = uVar24 + 8;
      }
      uVar16 = uVar24 | 3;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          uVar27 = 0;
          pvVar19 = pvVar37;
          do {
            pauVar10 = pauVar9;
            pvVar45 = pvVar19;
            lVar44 = 0;
            do {
              lVar29 = lVar44;
              in_ZMM4 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar45 + (long)pvVar19 * 4));
              *(undefined1 (*) [64])((long)*pauVar10 + lVar29) = in_ZMM4;
              pvVar45 = (void *)((long)pvVar45 + lVar25);
              lVar44 = lVar29 + 0x40;
            } while ((int)(lVar29 + 0x40) != 0x100);
            uVar27 = uVar27 + 1;
            pvVar19 = (void *)((long)pvVar19 + 4);
            pauVar9 = (undefined1 (*) [64])(pauVar10[1] + lVar29);
          } while (uVar27 != uVar22);
          pauVar9 = (undefined1 (*) [64])(pauVar10[1] + lVar29);
        }
        pvVar37 = (void *)((long)pvVar37 + (long)(int)(uVar21 * 4) * 4);
        uVar16 = uVar24 + 7;
        uVar24 = uVar24 + 4;
      }
      uVar16 = uVar24 | 1;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          uVar27 = 0;
          pvVar19 = pvVar37;
          do {
            pauVar10 = pauVar9;
            pvVar45 = pvVar19;
            lVar44 = 0;
            do {
              lVar29 = lVar44;
              in_ZMM4 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar45 + (long)pvVar19 * 4));
              *(undefined1 (*) [64])((long)*pauVar10 + lVar29) = in_ZMM4;
              pvVar45 = (void *)((long)pvVar45 + lVar25);
              lVar44 = lVar29 + 0x40;
            } while ((int)(lVar29 + 0x40) == 0x40);
            uVar27 = uVar27 + 1;
            pvVar19 = (void *)((long)pvVar19 + 4);
            pauVar9 = (undefined1 (*) [64])(pauVar10[1] + lVar29);
          } while (uVar27 != uVar22);
          pauVar9 = (undefined1 (*) [64])(pauVar10[1] + lVar29);
        }
        pvVar37 = (void *)((long)pvVar37 + (long)(int)(uVar21 * 2) * 4);
        uVar16 = uVar24 + 3;
        uVar24 = uVar24 + 2;
      }
      if ((int)uVar24 < inch) {
        do {
          uVar27 = uVar22;
          pvVar19 = pvVar37;
          if (0 < (int)uVar21) {
            do {
              in_ZMM4 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar19 + uVar27 * 4));
              *pauVar9 = in_ZMM4;
              pauVar9 = pauVar9 + 1;
              pvVar19 = (void *)((long)pvVar19 + 4);
              uVar27 = uVar27 - 1;
            } while (uVar27 != 0);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != inch);
      }
      uVar27 = uVar38 + 0x10;
      uVar34 = uVar38 + 0x1f;
      iVar15 = iVar15 + iVar8;
      iVar11 = iVar11 + iVar8;
      iVar30 = iVar30 + iVar8;
      iVar36 = iVar36 + iVar8;
      local_a4 = local_a4 + iVar8;
      iVar26 = iVar26 + iVar8;
      local_a8 = local_a8 + iVar8;
      iVar13 = iVar13 + iVar8;
      uVar38 = uVar27;
    } while (uVar34 < (uint)outch);
  }
  uVar24 = (uint)uVar27;
  if ((int)(uVar24 | 7) < outch) {
    iVar12 = uVar21 * inch;
    auVar51 = vpbroadcastd_avx512f();
    auVar52 = vpmovsxbd_avx512f(_DAT_005f2d80);
    auVar75 = vpmulld_avx2(auVar51._0_32_,auVar52._0_32_);
    vpmulld_avx512f(auVar51,auVar52);
    auVar50 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar75,auVar50);
    iVar36 = iVar12 * (uVar24 | 7);
    lVar17 = (long)(int)(uVar21 * 0x10) * 4;
    iVar15 = (uVar24 + 6) * iVar12;
    iVar11 = (uVar24 + 5) * iVar12;
    iVar30 = (uVar24 + 4) * iVar12;
    iVar26 = (uVar24 + 3) * iVar12;
    iVar13 = (uVar24 + 2) * iVar12;
    iVar8 = (uVar24 + 1) * iVar12;
    iVar40 = uVar24 * iVar12;
    iVar12 = iVar12 * 8;
    uVar38 = uVar27 & 0xffffffff;
    do {
      pauVar9 = (undefined1 (*) [64])
                ((ulong)(((uint)(uVar38 >> 4) & 0xfffffff) + (uint)(((uint)uVar38 >> 3 & 1) != 0)) *
                 kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
      pvVar37 = kernel->data;
      if (inch < 0x10) {
        uVar24 = 0;
      }
      else {
        pvVar19 = (void *)((long)iVar36 * 4 + (long)pvVar37);
        pvVar18 = (void *)((long)iVar15 * 4 + (long)pvVar37);
        pvVar42 = (void *)((long)iVar11 * 4 + (long)pvVar37);
        pvVar41 = (void *)((long)iVar30 * 4 + (long)pvVar37);
        pvVar31 = (void *)((long)iVar26 * 4 + (long)pvVar37);
        pvVar45 = (void *)((long)iVar13 * 4 + (long)pvVar37);
        pvVar43 = (void *)((long)iVar8 * 4 + (long)pvVar37);
        pvVar37 = (void *)((long)iVar40 * 4 + (long)pvVar37);
        iVar20 = 0;
        do {
          if (0 < (int)uVar21) {
            lVar25 = 0;
            do {
              auVar51 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar37 * 5 + lVar25));
              auVar52 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar43 + (long)pvVar37 * 4 + lVar25));
              auVar53 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar45 + (long)pvVar37 * 4 + lVar25));
              auVar54 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar31 + (long)pvVar37 * 4 + lVar25));
              auVar55 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar41 + (long)pvVar37 * 4 + lVar25));
              auVar56 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar42 + (long)pvVar37 * 4 + lVar25));
              auVar57 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar18 + (long)pvVar37 * 4 + lVar25));
              auVar58 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar19 + (long)pvVar37 * 4 + lVar25));
              auVar59 = vunpcklps_avx512f(auVar51,auVar52);
              auVar51 = vunpckhps_avx512f(auVar51,auVar52);
              auVar52 = vunpcklps_avx512f(auVar53,auVar54);
              auVar53 = vunpckhps_avx512f(auVar53,auVar54);
              auVar54 = vunpcklps_avx512f(auVar55,auVar56);
              auVar55 = vunpckhps_avx512f(auVar55,auVar56);
              auVar56 = vunpcklps_avx512f(auVar57,auVar58);
              auVar57 = vunpckhps_avx512f(auVar57,auVar58);
              auVar58 = vunpcklpd_avx512f(auVar59,auVar52);
              auVar52 = vunpckhpd_avx512f(auVar59,auVar52);
              auVar59 = vunpcklpd_avx512f(auVar51,auVar53);
              auVar51 = vunpckhpd_avx512f(auVar51,auVar53);
              auVar53 = vunpcklpd_avx512f(auVar54,auVar56);
              auVar54 = vunpckhpd_avx512f(auVar54,auVar56);
              auVar56 = vunpcklpd_avx512f(auVar55,auVar57);
              auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
              auVar57 = vshuff64x2_avx512f(auVar58,auVar53,0x88);
              auVar60 = vshuff64x2_avx512f(auVar52,auVar54,0x88);
              auVar61 = vshuff64x2_avx512f(auVar59,auVar56,0x88);
              auVar62 = vshuff64x2_avx512f(auVar51,auVar55,0x88);
              in_ZMM5 = vshuff64x2_avx512f(auVar58,auVar53,0xdd);
              auVar52 = vshuff64x2_avx512f(auVar52,auVar54,0xdd);
              in_ZMM6 = vshuff64x2_avx512f(auVar59,auVar56,0xdd);
              auVar51 = vshuff64x2_avx512f(auVar51,auVar55,0xdd);
              in_ZMM7 = vshuff64x2_avx512f(auVar57,auVar60,0x88);
              in_ZMM8 = vshuff64x2_avx512f(auVar61,auVar62,0x88);
              auVar53 = vshuff64x2_avx512f(in_ZMM5,auVar52,0x88);
              auVar54 = vshuff64x2_avx512f(in_ZMM6,auVar51,0x88);
              auVar55 = vshuff64x2_avx512f(auVar57,auVar60,0xdd);
              auVar56 = vshuff64x2_avx512f(auVar61,auVar62,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(in_ZMM5,auVar52,0xdd);
              in_ZMM3 = vshuff64x2_avx512f(in_ZMM6,auVar51,0xdd);
              *pauVar9 = in_ZMM7;
              pauVar9[1] = in_ZMM8;
              pauVar9[2] = auVar53;
              pauVar9[3] = auVar54;
              pauVar9[4] = auVar55;
              pauVar9[5] = auVar56;
              pauVar9[6] = in_ZMM4;
              pauVar9[7] = in_ZMM3;
              pauVar9 = pauVar9 + 8;
              lVar25 = lVar25 + 4;
            } while (uVar22 * 4 - lVar25 != 0);
          }
          pvVar37 = (void *)((long)pvVar37 + lVar17);
          pvVar43 = (void *)((long)pvVar43 + lVar17);
          pvVar45 = (void *)((long)pvVar45 + lVar17);
          pvVar31 = (void *)((long)pvVar31 + lVar17);
          pvVar41 = (void *)((long)pvVar41 + lVar17);
          pvVar42 = (void *)((long)pvVar42 + lVar17);
          pvVar18 = (void *)((long)pvVar18 + lVar17);
          pvVar19 = (void *)((long)pvVar19 + lVar17);
          iVar28 = iVar20 + 0x1f;
          iVar20 = iVar20 + 0x10;
          uVar24 = inch & 0xfffffff0;
        } while (iVar28 < inch);
      }
      uVar16 = uVar24 | 7;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          lVar25 = 0;
          do {
            auVar75 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
            auVar50 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar49 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar76 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar77 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar78 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar79 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar80 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar82 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vunpcklps_avx(auVar50,auVar49);
            auVar50 = vunpckhps_avx(auVar50,auVar49);
            auVar3 = vunpcklps_avx(auVar76,auVar77);
            auVar49 = vunpckhps_avx(auVar76,auVar77);
            auVar4 = vunpcklps_avx(auVar78,auVar79);
            auVar76 = vunpckhps_avx(auVar78,auVar79);
            auVar81 = vunpcklps_avx(auVar80,auVar82);
            auVar77 = vunpckhps_avx(auVar80,auVar82);
            auVar78 = vunpcklpd_avx(auVar75,auVar3);
            auVar75 = vunpckhpd_avx(auVar75,auVar3);
            auVar3 = vunpcklpd_avx(auVar50,auVar49);
            auVar50 = vunpckhpd_avx(auVar50,auVar49);
            auVar79 = vunpcklpd_avx(auVar4,auVar81);
            auVar49 = vunpckhpd_avx(auVar4,auVar81);
            in_ZMM7 = ZEXT3264(auVar49);
            auVar4 = vunpcklpd_avx(auVar76,auVar77);
            auVar76 = vunpckhpd_avx(auVar76,auVar77);
            in_ZMM8 = ZEXT3264(auVar76);
            auVar81._16_16_ = auVar79._0_16_;
            auVar81._0_16_ = auVar78._0_16_;
            auVar80._16_16_ = auVar49._0_16_;
            auVar80._0_16_ = auVar75._0_16_;
            auVar82._16_16_ = auVar4._0_16_;
            auVar82._0_16_ = auVar3._0_16_;
            auVar83._16_16_ = auVar76._0_16_;
            auVar83._0_16_ = auVar50._0_16_;
            auVar77 = vperm2f128_avx(auVar78,auVar79,0x31);
            in_ZMM6 = ZEXT3264(auVar77);
            auVar75 = vperm2f128_avx(auVar75,auVar49,0x31);
            in_ZMM3 = ZEXT3264(auVar75);
            auVar49 = vperm2f128_avx(auVar3,auVar4,0x31);
            in_ZMM5 = ZEXT3264(auVar49);
            auVar50 = vperm2f128_avx(auVar50,auVar76,0x31);
            in_ZMM4 = ZEXT3264(auVar50);
            *(undefined1 (*) [32])*pauVar9 = auVar81;
            *(undefined1 (*) [32])((long)*pauVar9 + 0x20) = auVar80;
            *(undefined1 (*) [32])pauVar9[1] = auVar82;
            *(undefined1 (*) [32])(pauVar9[1] + 0x20) = auVar83;
            *(undefined1 (*) [32])pauVar9[2] = auVar77;
            *(undefined1 (*) [32])(pauVar9[2] + 0x20) = auVar75;
            *(undefined1 (*) [32])pauVar9[3] = auVar49;
            *(undefined1 (*) [32])(pauVar9[3] + 0x20) = auVar50;
            pauVar9 = pauVar9 + 4;
            lVar25 = lVar25 + 4;
          } while (uVar22 * 4 - lVar25 != 0);
        }
        uVar16 = uVar24 + 0xf;
        uVar24 = uVar24 + 8;
      }
      uVar16 = uVar24 | 3;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          uVar27 = 0;
          do {
            pauVar10 = pauVar9;
            lVar25 = 0;
            do {
              auVar75 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar75 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
              in_ZMM4 = ZEXT3264(auVar75);
              in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])((long)*pauVar10 + lVar25) = auVar75;
              lVar25 = lVar25 + 0x20;
            } while ((int)lVar25 != 0x80);
            uVar27 = uVar27 + 1;
            pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar25);
          } while (uVar27 != uVar22);
          pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar25);
        }
        uVar16 = uVar24 + 7;
        uVar24 = uVar24 + 4;
      }
      uVar16 = uVar24 | 1;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          uVar27 = 0;
          do {
            pauVar10 = pauVar9;
            lVar25 = 0;
            do {
              auVar75 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar75 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
              in_ZMM4 = ZEXT3264(auVar75);
              in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])((long)*pauVar10 + lVar25) = auVar75;
              lVar25 = lVar25 + 0x20;
            } while ((int)lVar25 == 0x20);
            uVar27 = uVar27 + 1;
            pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar25);
          } while (uVar27 != uVar22);
          pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar25);
        }
        uVar16 = uVar24 + 3;
        uVar24 = uVar24 + 2;
      }
      if ((int)uVar24 < inch) {
        do {
          uVar27 = uVar22;
          if (0 < (int)uVar21) {
            do {
              auVar75 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar75 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
              in_ZMM4 = ZEXT3264(auVar75);
              in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])*pauVar9 = auVar75;
              pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + 0x20);
              uVar27 = uVar27 - 1;
            } while (uVar27 != 0);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != inch);
      }
      uVar27 = uVar38 + 8;
      lVar25 = uVar38 + 0xf;
      iVar36 = iVar36 + iVar12;
      iVar15 = iVar15 + iVar12;
      iVar11 = iVar11 + iVar12;
      iVar30 = iVar30 + iVar12;
      iVar26 = iVar26 + iVar12;
      iVar13 = iVar13 + iVar12;
      iVar8 = iVar8 + iVar12;
      iVar40 = iVar40 + iVar12;
      uVar38 = uVar27;
    } while (lVar25 < outch);
    uVar27 = uVar27 & 0xffffffff;
  }
  uVar24 = (uint)uVar27;
  if ((int)(uVar24 | 3) < outch) {
    iVar26 = uVar21 * inch;
    auVar51 = vpbroadcastd_avx512f();
    auVar52 = vpmovsxbd_avx512f(_DAT_005f2d80);
    auVar1 = vpmulld_avx(auVar51._0_16_,auVar52._0_16_);
    vpmulld_avx2(auVar51._0_32_,auVar52._0_32_);
    vpmulld_avx512f(auVar51,auVar52);
    auVar48 = vpbroadcastd_avx512vl();
    vpmulld_avx(auVar1,auVar48);
    iVar13 = iVar26 * (uVar24 | 3);
    iVar30 = iVar26 * 4;
    lVar25 = (long)(int)(uVar21 * 0x10) * 4;
    iVar15 = (uVar24 + 2) * iVar26;
    iVar11 = (uVar24 + 1) * iVar26;
    iVar26 = uVar24 * iVar26;
    lVar17 = uVar22 * 4;
    uVar27 = uVar27 & 0xffffffff;
    do {
      pauVar9 = (undefined1 (*) [64])
                ((ulong)(((uint)(uVar27 >> 3) & 1) + ((uint)(uVar27 >> 4) & 0xfffffff) +
                        (uint)(((uint)uVar27 >> 2 & 1) != 0)) * kernel_tm->cstep *
                 kernel_tm->elemsize + (long)kernel_tm->data);
      pvVar37 = kernel->data;
      if (inch < 0x10) {
        uVar24 = 0;
      }
      else {
        pvVar43 = (void *)((long)iVar13 * 4 + (long)pvVar37);
        pvVar19 = (void *)((long)iVar15 * 4 + (long)pvVar37);
        pvVar45 = (void *)((long)iVar11 * 4 + (long)pvVar37);
        pvVar37 = (void *)((long)iVar26 * 4 + (long)pvVar37);
        iVar8 = 0;
        do {
          if (0 < (int)uVar21) {
            lVar44 = 0;
            do {
              lVar29 = (long)pvVar43 + lVar44;
              auVar51 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar37 + lVar29 * 4 + lVar44));
              auVar52 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar45 + lVar29 * 4 + lVar44));
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar19 + lVar29 * 4 + lVar44));
              auVar54 = vgatherdps_avx512f(*(undefined4 *)(lVar29 * 5));
              auVar55 = vunpcklps_avx512f(auVar51,auVar52);
              auVar51 = vunpckhps_avx512f(auVar51,auVar52);
              auVar52 = vunpcklps_avx512f(auVar53,auVar54);
              auVar53 = vunpckhps_avx512f(auVar53,auVar54);
              auVar54 = vunpcklpd_avx512f(auVar55,auVar52);
              auVar52 = vunpckhpd_avx512f(auVar55,auVar52);
              auVar55 = vunpcklpd_avx512f(auVar51,auVar53);
              auVar51 = vunpckhpd_avx512f(auVar51,auVar53);
              auVar53 = vshuff64x2_avx512f(auVar54,auVar52,0x88);
              auVar56 = vshuff64x2_avx512f(auVar55,auVar51,0x88);
              in_ZMM5 = vshuff64x2_avx512f(auVar54,auVar52,0xdd);
              auVar51 = vshuff64x2_avx512f(auVar55,auVar51,0xdd);
              in_ZMM7 = vshuff64x2_avx512f(auVar53,auVar56,0x88);
              in_ZMM8 = vshuff64x2_avx512f(in_ZMM5,auVar51,0x88);
              in_ZMM6 = vshuff64x2_avx512f(auVar53,auVar56,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(in_ZMM5,auVar51,0xdd);
              *pauVar9 = in_ZMM7;
              pauVar9[1] = in_ZMM8;
              pauVar9[2] = in_ZMM6;
              pauVar9[3] = in_ZMM4;
              pauVar9 = pauVar9 + 4;
              lVar44 = lVar44 + 4;
            } while (lVar17 - lVar44 != 0);
          }
          pvVar37 = (void *)((long)pvVar37 + lVar25);
          pvVar45 = (void *)((long)pvVar45 + lVar25);
          pvVar19 = (void *)((long)pvVar19 + lVar25);
          pvVar43 = (void *)((long)pvVar43 + lVar25);
          iVar12 = iVar8 + 0x1f;
          iVar8 = iVar8 + 0x10;
          uVar24 = inch & 0xfffffff0;
        } while (iVar12 < inch);
      }
      uVar16 = uVar24 | 7;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          lVar44 = 0;
          do {
            auVar75 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
            auVar50 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
            auVar49 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar75);
            auVar75 = vpcmpeqd_avx2(in_ZMM7._0_32_,in_ZMM7._0_32_);
            auVar76 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar75);
            auVar75 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
            auVar78 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar75);
            auVar75 = vunpcklps_avx(auVar50,auVar49);
            auVar50 = vunpckhps_avx(auVar50,auVar49);
            auVar77 = vunpcklps_avx(auVar76,auVar78);
            auVar49 = vunpckhps_avx(auVar76,auVar78);
            auVar76 = vunpcklpd_avx(auVar75,auVar77);
            in_ZMM7 = ZEXT3264(auVar76);
            auVar75 = vunpckhpd_avx(auVar75,auVar77);
            auVar77 = vunpcklpd_avx(auVar50,auVar49);
            in_ZMM8 = ZEXT3264(auVar77);
            auVar50 = vunpckhpd_avx(auVar50,auVar49);
            auVar49._16_16_ = auVar75._0_16_;
            auVar49._0_16_ = auVar76._0_16_;
            in_ZMM6 = ZEXT3264(auVar49);
            auVar78._16_16_ = auVar50._0_16_;
            auVar78._0_16_ = auVar77._0_16_;
            auVar75 = vperm2f128_avx(auVar76,auVar75,0x31);
            in_ZMM5 = ZEXT3264(auVar75);
            auVar50 = vperm2f128_avx(auVar77,auVar50,0x31);
            in_ZMM4 = ZEXT3264(auVar50);
            *(undefined1 (*) [32])*pauVar9 = auVar49;
            *(undefined1 (*) [32])((long)*pauVar9 + 0x20) = auVar78;
            *(undefined1 (*) [32])pauVar9[1] = auVar75;
            *(undefined1 (*) [32])(pauVar9[1] + 0x20) = auVar50;
            pauVar9 = pauVar9 + 2;
            lVar44 = lVar44 + 4;
          } while (lVar17 - lVar44 != 0);
        }
        uVar16 = uVar24 + 0xf;
        uVar24 = uVar24 + 8;
      }
      uVar16 = uVar24 | 3;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          lVar44 = 0;
          do {
            auVar1 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar5 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar6 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar7 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar48 = vunpcklps_avx(auVar5,auVar6);
            auVar2 = vunpcklps_avx(auVar7,auVar1);
            auVar5 = vunpckhps_avx(auVar5,auVar6);
            auVar6 = vunpckhps_avx(auVar7,auVar1);
            in_ZMM6 = ZEXT1664(auVar6);
            auVar1 = vmovlhps_avx(auVar48,auVar2);
            in_ZMM7 = ZEXT1664(auVar1);
            auVar2 = vunpckhpd_avx(auVar48,auVar2);
            in_ZMM4 = ZEXT1664(auVar2);
            auVar48 = vmovlhps_avx(auVar5,auVar6);
            in_ZMM8 = ZEXT1664(auVar48);
            auVar5 = vunpckhpd_avx(auVar5,auVar6);
            in_ZMM5 = ZEXT1664(auVar5);
            *(undefined1 (*) [16])*pauVar9 = auVar1;
            *(undefined1 (*) [16])((long)*pauVar9 + 0x10) = auVar2;
            *(undefined1 (*) [16])((long)*pauVar9 + 0x20) = auVar48;
            *(undefined1 (*) [16])((long)*pauVar9 + 0x30) = auVar5;
            pauVar9 = pauVar9 + 1;
            lVar44 = lVar44 + 4;
          } while (lVar17 - lVar44 != 0);
        }
        uVar16 = uVar24 + 7;
        uVar24 = uVar24 + 4;
      }
      uVar16 = uVar24 | 1;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          uVar38 = 0;
          do {
            pauVar10 = pauVar9;
            lVar44 = 0;
            do {
              auVar1 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
              auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
              in_ZMM5 = ZEXT1664(auVar1);
              in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
              *(undefined1 (*) [16])((long)*pauVar10 + lVar44) = auVar1;
              lVar44 = lVar44 + 0x10;
            } while ((int)lVar44 == 0x10);
            uVar38 = uVar38 + 1;
            pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar44);
          } while (uVar38 != uVar22);
          pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar44);
        }
        uVar16 = uVar24 + 3;
        uVar24 = uVar24 + 2;
      }
      if ((int)uVar24 < inch) {
        do {
          uVar38 = uVar22;
          if (0 < (int)uVar21) {
            do {
              auVar1 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
              auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
              in_ZMM5 = ZEXT1664(auVar1);
              in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
              *(undefined1 (*) [16])*pauVar9 = auVar1;
              pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + 0x10);
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != inch);
      }
      uVar38 = uVar27 + 4;
      lVar44 = uVar27 + 7;
      iVar13 = iVar13 + iVar30;
      iVar15 = iVar15 + iVar30;
      iVar11 = iVar11 + iVar30;
      iVar26 = iVar26 + iVar30;
      uVar27 = uVar38;
    } while (lVar44 < outch);
    uVar24 = (uint)uVar38;
  }
  uVar16 = uVar24 | 1;
  if ((int)uVar16 < outch) {
    iVar11 = uVar21 * inch;
    auVar52 = vpbroadcastd_avx512f();
    auVar51 = vpmovsxbd_avx512f(_DAT_005f2d80);
    vpmulld_avx(auVar52._0_16_,auVar51._0_16_);
    vpmulld_avx2(auVar52._0_32_,auVar51._0_32_);
    vpmulld_avx512f(auVar52,auVar51);
    lVar25 = (long)(int)(uVar21 * 8);
    iVar15 = iVar11 * uVar16;
    lVar32 = (long)(int)(uVar21 * 0x10) * 4;
    iVar30 = uVar24 * iVar11;
    lVar17 = uVar22 * 4;
    lVar44 = (long)(int)(uVar21 * 4) * 4;
    lVar29 = (long)(int)(uVar21 * 2) * 4;
    uVar27 = (long)(int)uVar24;
    do {
      uVar24 = (uint)uVar27;
      pauVar9 = (undefined1 (*) [64])
                ((ulong)(((uint)(uVar27 >> 2) & 1) +
                         ((uint)(uVar27 >> 4) & 0xfffffff) + (uint)((uVar24 >> 3 & 1) != 0) +
                        (uint)((uVar24 >> 1 & 1) != 0)) * kernel_tm->cstep * kernel_tm->elemsize +
                (long)kernel_tm->data);
      pvVar37 = kernel->data;
      if (inch < 0x10) {
        pvVar19 = (void *)((long)pvVar37 + (long)(int)(iVar11 * uVar24) * 4);
        pvVar45 = (void *)((long)pvVar37 + (long)(int)(uVar16 * iVar11) * 4);
        uVar24 = 0;
      }
      else {
        pvVar45 = (void *)((long)iVar15 * 4 + (long)pvVar37);
        pvVar19 = (void *)((long)iVar30 * 4 + (long)pvVar37);
        iVar26 = 0;
        do {
          if (0 < (int)uVar21) {
            lVar14 = 0;
            do {
              auVar51 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar19 + lVar25 * 0x10 + lVar14));
              auVar52 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar45 + lVar25 * 0x10 + lVar14));
              *pauVar9 = auVar51;
              pauVar9[1] = auVar52;
              pauVar9 = pauVar9 + 2;
              lVar14 = lVar14 + 4;
            } while (lVar17 - lVar14 != 0);
          }
          pvVar19 = (void *)((long)pvVar19 + lVar32);
          pvVar45 = (void *)((long)pvVar45 + lVar32);
          iVar13 = iVar26 + 0x1f;
          iVar26 = iVar26 + 0x10;
          uVar24 = inch & 0xfffffff0;
        } while (iVar13 < inch);
      }
      uVar16 = uVar24 | 7;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          lVar14 = 0;
          do {
            auVar75 = vpcmpeqd_avx2(auVar51._0_32_,auVar51._0_32_);
            auVar50 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar75 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar51 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar9 = auVar50;
            *(undefined1 (*) [32])((long)*pauVar9 + 0x20) = auVar75;
            pauVar9 = pauVar9 + 1;
            lVar14 = lVar14 + 4;
          } while (lVar17 - lVar14 != 0);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar25 * 4);
        pvVar45 = (void *)((long)pvVar45 + lVar25 * 4);
        uVar16 = uVar24 + 0xf;
        uVar24 = uVar24 + 8;
      }
      uVar16 = uVar24 | 3;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          lVar14 = 0;
          do {
            auVar1 = vpcmpeqd_avx(auVar51._0_16_,auVar51._0_16_);
            auVar48 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar51 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar9 = auVar48;
            *(undefined1 (*) [16])((long)*pauVar9 + 0x10) = auVar1;
            pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + 0x20);
            lVar14 = lVar14 + 4;
          } while (lVar17 - lVar14 != 0);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar44);
        pvVar45 = (void *)((long)pvVar45 + lVar44);
        uVar16 = uVar24 + 7;
        uVar24 = uVar24 + 4;
      }
      uVar16 = uVar24 | 1;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          uVar38 = 0;
          pvVar37 = pvVar19;
          pvVar43 = pvVar45;
          do {
            pauVar10 = pauVar9;
            lVar46 = 0;
            lVar14 = 0;
            do {
              *(undefined4 *)((long)*pauVar10 + lVar14) = *(undefined4 *)((long)pvVar37 + lVar46);
              auVar51 = ZEXT464(*(uint *)((long)pvVar43 + lVar46));
              *(uint *)((long)*pauVar10 + lVar14 + 4) = *(uint *)((long)pvVar43 + lVar46);
              lVar14 = lVar14 + 8;
              lVar46 = lVar46 + (long)(int)uVar21 * 4;
            } while ((int)lVar14 == 8);
            uVar38 = uVar38 + 1;
            pvVar43 = (void *)((long)pvVar43 + 4);
            pvVar37 = (void *)((long)pvVar37 + 4);
            pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar14);
          } while (uVar38 != uVar22);
          pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar14);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar29);
        pvVar45 = (void *)((long)pvVar45 + lVar29);
        uVar16 = uVar24 + 3;
        uVar24 = uVar24 + 2;
      }
      if ((int)uVar24 < inch) {
        do {
          if (0 < (int)uVar21) {
            lVar14 = 0;
            uVar38 = 0;
            do {
              *(undefined4 *)((long)*pauVar9 + uVar38 * 8) =
                   *(undefined4 *)((long)pvVar19 + uVar38 * 4);
              uVar16 = *(uint *)((long)pvVar45 + uVar38 * 4);
              auVar51 = ZEXT464(uVar16);
              *(uint *)((long)*pauVar9 + uVar38 * 8 + 4) = uVar16;
              uVar38 = uVar38 + 1;
              lVar14 = lVar14 + -8;
            } while (uVar22 != uVar38);
            pauVar9 = (undefined1 (*) [64])((long)pauVar9 - lVar14);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != inch);
      }
      uVar38 = uVar27 + 2;
      lVar14 = uVar27 + 3;
      uVar16 = (uint)lVar14;
      iVar15 = iVar15 + iVar11 * 2;
      iVar30 = iVar30 + iVar11 * 2;
      uVar27 = uVar38;
    } while (lVar14 < outch);
    uVar24 = (uint)uVar38;
  }
  if ((int)uVar24 < outch) {
    iVar15 = uVar21 * inch;
    auVar52 = vpbroadcastd_avx512f();
    auVar51 = vpmovsxbd_avx512f(_DAT_005f2d80);
    vpmulld_avx(auVar52._0_16_,auVar51._0_16_);
    vpmulld_avx2(auVar52._0_32_,auVar51._0_32_);
    vpmulld_avx512f(auVar52,auVar51);
    uVar27 = (ulong)(int)uVar24;
    iVar11 = uVar24 * iVar15;
    lVar17 = uVar22 * 4;
    do {
      uVar24 = (uint)uVar27;
      pauVar9 = (undefined1 (*) [64])
                ((ulong)((uVar24 & 1) + ((uint)(uVar27 >> 4) & 0xfffffff) +
                         (uint)((uVar24 >> 3 & 1) != 0) + ((uint)(uVar27 >> 2) & 1) +
                        (uint)((uVar24 >> 1 & 1) != 0)) * kernel_tm->cstep * kernel_tm->elemsize +
                (long)kernel_tm->data);
      if (inch < 0x10) {
        puVar47 = (uint *)((long)kernel->data + (long)(int)(iVar15 * uVar24) * 4);
        uVar24 = 0;
      }
      else {
        puVar47 = (uint *)((long)kernel->data + (long)iVar11 * 4);
        iVar30 = 0;
        do {
          if (0 < (int)uVar21) {
            lVar25 = 0;
            do {
              auVar51 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)puVar47 + (long)(int)(uVar21 * 8) * 0x10 + lVar25
                                            ));
              *pauVar9 = auVar51;
              pauVar9 = pauVar9 + 1;
              lVar25 = lVar25 + 4;
            } while (lVar17 - lVar25 != 0);
          }
          puVar47 = puVar47 + (int)(uVar21 * 0x10);
          iVar26 = iVar30 + 0x1f;
          iVar30 = iVar30 + 0x10;
          uVar24 = inch & 0xfffffff0;
        } while (iVar26 < inch);
      }
      uVar16 = uVar24 | 7;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          lVar25 = 0;
          do {
            auVar75 = vpcmpeqd_avx2(auVar51._0_32_,auVar51._0_32_);
            auVar75 = vgatherdps(ZEXT832(0) << 0x40,auVar75);
            auVar51 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar9 = auVar75;
            pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + 0x20);
            lVar25 = lVar25 + 4;
          } while (lVar17 - lVar25 != 0);
        }
        puVar47 = puVar47 + (int)(uVar21 * 8);
        uVar16 = uVar24 + 0xf;
        uVar24 = uVar24 + 8;
      }
      uVar16 = uVar24 | 3;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          lVar25 = 0;
          do {
            auVar1 = vpcmpeqd_avx(auVar51._0_16_,auVar51._0_16_);
            auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar51 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar9 = auVar1;
            pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + 0x10);
            lVar25 = lVar25 + 4;
          } while (lVar17 - lVar25 != 0);
        }
        puVar47 = puVar47 + (int)(uVar21 * 4);
        uVar16 = uVar24 + 7;
        uVar24 = uVar24 + 4;
      }
      uVar16 = uVar24 | 1;
      while ((int)uVar16 < inch) {
        if (0 < (int)uVar21) {
          uVar38 = 0;
          puVar23 = puVar47;
          do {
            pauVar10 = pauVar9;
            lVar25 = 0;
            puVar35 = puVar23;
            do {
              auVar51 = ZEXT464(*puVar35);
              *(uint *)((long)*pauVar10 + lVar25) = *puVar35;
              lVar25 = lVar25 + 4;
              puVar35 = puVar35 + (int)uVar21;
            } while ((int)lVar25 == 4);
            uVar38 = uVar38 + 1;
            puVar23 = puVar23 + 1;
            pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar25);
          } while (uVar38 != uVar22);
          pauVar9 = (undefined1 (*) [64])((long)*pauVar10 + lVar25);
        }
        puVar47 = puVar47 + (int)(uVar21 * 2);
        uVar16 = uVar24 + 3;
        uVar24 = uVar24 + 2;
      }
      if ((int)uVar24 < inch) {
        do {
          if (0 < (int)uVar21) {
            lVar25 = 0;
            do {
              auVar51 = ZEXT464(*(uint *)((long)puVar47 + lVar25));
              *(uint *)((long)*pauVar9 + lVar25) = *(uint *)((long)puVar47 + lVar25);
              lVar25 = lVar25 + 4;
            } while (lVar17 - lVar25 != 0);
            pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + lVar25);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != inch);
      }
      uVar27 = uVar27 + 1;
      iVar11 = iVar11 + iVar15;
    } while (uVar27 != (long)outch);
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed(const Mat& kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb

    // clang-format off
    // *INDENT-OFF*
#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (outch >= 16)
    {
        if (inch >= 16)
            kernel_tm.create(16 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 8)
            kernel_tm.create(16 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 4)
            kernel_tm.create(16 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 2)
            kernel_tm.create(16 * 2 * maxk, inch / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else
            kernel_tm.create(16 * maxk, inch, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
    }
    else
#endif // __AVX512F__
    if (outch >= 8)
    {
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(8 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(8 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 4)
            kernel_tm.create(8 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 2)
            kernel_tm.create(8 * 2 * maxk, inch / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else
            kernel_tm.create(8 * maxk, inch, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
    }
    else
#endif // __AVX__
    if (outch >= 4)
    {
#if __AVX__
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(4 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(4 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else
#endif // __AVX__
        if (inch >= 4)
            kernel_tm.create(4 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 2)
            kernel_tm.create(4 * 2 * maxk, inch / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else
            kernel_tm.create(4 * maxk, inch, outch / 4 + (outch % 4) / 2 + outch % 2);
    }
    else
#endif // __SSE2__
    if (outch >= 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(2 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 2 + outch % 2);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(2 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 2 + outch % 2);
        else
#endif // __AVX__
        if (inch >= 4)
            kernel_tm.create(2 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 2 + outch % 2);
        else
#endif // __SSE2__
        if (inch >= 2)
            kernel_tm.create(2 * 2 * maxk, inch / 2 + inch % 2, outch / 2 + outch % 2);
        else
            kernel_tm.create(2 * maxk, inch, outch / 2 + outch % 2);
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch);
        else
#endif // __AVX__
        if (inch >= 4)
            kernel_tm.create(4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch);
        else
#endif // __SSE2__
        if (inch >= 2)
            kernel_tm.create(2 * maxk, inch / 2 + inch % 2, outch);
        else
            kernel_tm.create(maxk, inch, outch);
    }
    // *INDENT-ON*
    // clang-format on

    int q = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; q + 15 < outch; q += 16)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;
        const float* kptr2 = (const float*)kernel + (q + 2) * inch * maxk;
        const float* kptr3 = (const float*)kernel + (q + 3) * inch * maxk;
        const float* kptr4 = (const float*)kernel + (q + 4) * inch * maxk;
        const float* kptr5 = (const float*)kernel + (q + 5) * inch * maxk;
        const float* kptr6 = (const float*)kernel + (q + 6) * inch * maxk;
        const float* kptr7 = (const float*)kernel + (q + 7) * inch * maxk;
        const float* kptr8 = (const float*)kernel + (q + 8) * inch * maxk;
        const float* kptr9 = (const float*)kernel + (q + 9) * inch * maxk;
        const float* kptra = (const float*)kernel + (q + 10) * inch * maxk;
        const float* kptrb = (const float*)kernel + (q + 11) * inch * maxk;
        const float* kptrc = (const float*)kernel + (q + 12) * inch * maxk;
        const float* kptrd = (const float*)kernel + (q + 13) * inch * maxk;
        const float* kptre = (const float*)kernel + (q + 14) * inch * maxk;
        const float* kptrf = (const float*)kernel + (q + 15) * inch * maxk;

        float* g00 = kernel_tm.channel(q / 16);

        __m512i _vindex = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex = _mm512_mullo_epi32(_vindex, _mm512_set1_epi32(maxk));

        int p = 0;
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;
                const float* k8 = kptr8 + k;
                const float* k9 = kptr9 + k;
                const float* ka = kptra + k;
                const float* kb = kptrb + k;
                const float* kc = kptrc + k;
                const float* kd = kptrd + k;
                const float* ke = kptre + k;
                const float* kf = kptrf + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex, k1, sizeof(float));
                __m512 _k2 = _mm512_i32gather_ps(_vindex, k2, sizeof(float));
                __m512 _k3 = _mm512_i32gather_ps(_vindex, k3, sizeof(float));
                __m512 _k4 = _mm512_i32gather_ps(_vindex, k4, sizeof(float));
                __m512 _k5 = _mm512_i32gather_ps(_vindex, k5, sizeof(float));
                __m512 _k6 = _mm512_i32gather_ps(_vindex, k6, sizeof(float));
                __m512 _k7 = _mm512_i32gather_ps(_vindex, k7, sizeof(float));
                __m512 _k8 = _mm512_i32gather_ps(_vindex, k8, sizeof(float));
                __m512 _k9 = _mm512_i32gather_ps(_vindex, k9, sizeof(float));
                __m512 _ka = _mm512_i32gather_ps(_vindex, ka, sizeof(float));
                __m512 _kb = _mm512_i32gather_ps(_vindex, kb, sizeof(float));
                __m512 _kc = _mm512_i32gather_ps(_vindex, kc, sizeof(float));
                __m512 _kd = _mm512_i32gather_ps(_vindex, kd, sizeof(float));
                __m512 _ke = _mm512_i32gather_ps(_vindex, ke, sizeof(float));
                __m512 _kf = _mm512_i32gather_ps(_vindex, kf, sizeof(float));

                transpose16x16_ps(_k0, _k1, _k2, _k3, _k4, _k5, _k6, _k7, _k8, _k9, _ka, _kb, _kc, _kd, _ke, _kf);

                _mm512_store_ps(g00, _k0);
                _mm512_store_ps(g00 + 16, _k1);
                _mm512_store_ps(g00 + 16 * 2, _k2);
                _mm512_store_ps(g00 + 16 * 3, _k3);
                _mm512_store_ps(g00 + 16 * 4, _k4);
                _mm512_store_ps(g00 + 16 * 5, _k5);
                _mm512_store_ps(g00 + 16 * 6, _k6);
                _mm512_store_ps(g00 + 16 * 7, _k7);
                _mm512_store_ps(g00 + 16 * 8, _k8);
                _mm512_store_ps(g00 + 16 * 9, _k9);
                _mm512_store_ps(g00 + 16 * 10, _ka);
                _mm512_store_ps(g00 + 16 * 11, _kb);
                _mm512_store_ps(g00 + 16 * 12, _kc);
                _mm512_store_ps(g00 + 16 * 13, _kd);
                _mm512_store_ps(g00 + 16 * 14, _ke);
                _mm512_store_ps(g00 + 16 * 15, _kf);

                g00 += 256;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
            kptr2 += maxk * 16;
            kptr3 += maxk * 16;
            kptr4 += maxk * 16;
            kptr5 += maxk * 16;
            kptr6 += maxk * 16;
            kptr7 += maxk * 16;
            kptr8 += maxk * 16;
            kptr9 += maxk * 16;
            kptra += maxk * 16;
            kptrb += maxk * 16;
            kptrc += maxk * 16;
            kptrd += maxk * 16;
            kptre += maxk * 16;
            kptrf += maxk * 16;
        }

        _vindex = _mm512_mullo_epi32(_vindex, _mm512_set1_epi32(inch));

        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                for (int i = 0; i < 8; i++)
                {
                    __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                    _mm512_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 16;
                }
            }

            kptr0 += maxk * 8;
        }
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                for (int i = 0; i < 4; i++)
                {
                    __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                    _mm512_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 16;
                }
            }

            kptr0 += maxk * 4;
        }
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                for (int i = 0; i < 2; i++)
                {
                    __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                    _mm512_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 16;
                }
            }

            kptr0 += maxk * 2;
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                _mm512_store_ps(g00, _k0);
                g00 += 16;
            }
        }
    }
#endif // __AVX512F__
    for (; q + 7 < outch; q += 8)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;
        const float* kptr2 = (const float*)kernel + (q + 2) * inch * maxk;
        const float* kptr3 = (const float*)kernel + (q + 3) * inch * maxk;
        const float* kptr4 = (const float*)kernel + (q + 4) * inch * maxk;
        const float* kptr5 = (const float*)kernel + (q + 5) * inch * maxk;
        const float* kptr6 = (const float*)kernel + (q + 6) * inch * maxk;
        const float* kptr7 = (const float*)kernel + (q + 7) * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8);
#else
        float* g00 = kernel_tm.channel(q / 8);
#endif

#if __AVX2__
        __m256i _vindex = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex = _mm256_mullo_epi32(_vindex, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex_512, k1, sizeof(float));
                __m512 _k2 = _mm512_i32gather_ps(_vindex_512, k2, sizeof(float));
                __m512 _k3 = _mm512_i32gather_ps(_vindex_512, k3, sizeof(float));
                __m512 _k4 = _mm512_i32gather_ps(_vindex_512, k4, sizeof(float));
                __m512 _k5 = _mm512_i32gather_ps(_vindex_512, k5, sizeof(float));
                __m512 _k6 = _mm512_i32gather_ps(_vindex_512, k6, sizeof(float));
                __m512 _k7 = _mm512_i32gather_ps(_vindex_512, k7, sizeof(float));

                transpose16x8_ps(_k0, _k1, _k2, _k3, _k4, _k5, _k6, _k7);

                _mm512_storeu_ps(g00, _k0);
                _mm512_storeu_ps(g00 + 16, _k1);
                _mm512_storeu_ps(g00 + 16 * 2, _k2);
                _mm512_storeu_ps(g00 + 16 * 3, _k3);
                _mm512_storeu_ps(g00 + 16 * 4, _k4);
                _mm512_storeu_ps(g00 + 16 * 5, _k5);
                _mm512_storeu_ps(g00 + 16 * 6, _k6);
                _mm512_storeu_ps(g00 + 16 * 7, _k7);

                g00 += 128;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
            kptr2 += maxk * 16;
            kptr3 += maxk * 16;
            kptr4 += maxk * 16;
            kptr5 += maxk * 16;
            kptr6 += maxk * 16;
            kptr7 += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                __m256 _k1 = _mm256_i32gather_ps(k1, _vindex, sizeof(float));
                __m256 _k2 = _mm256_i32gather_ps(k2, _vindex, sizeof(float));
                __m256 _k3 = _mm256_i32gather_ps(k3, _vindex, sizeof(float));
                __m256 _k4 = _mm256_i32gather_ps(k4, _vindex, sizeof(float));
                __m256 _k5 = _mm256_i32gather_ps(k5, _vindex, sizeof(float));
                __m256 _k6 = _mm256_i32gather_ps(k6, _vindex, sizeof(float));
                __m256 _k7 = _mm256_i32gather_ps(k7, _vindex, sizeof(float));

                transpose8x8_ps(_k0, _k1, _k2, _k3, _k4, _k5, _k6, _k7);

                _mm256_store_ps(g00, _k0);
                _mm256_store_ps(g00 + 8, _k1);
                _mm256_store_ps(g00 + 8 * 2, _k2);
                _mm256_store_ps(g00 + 8 * 3, _k3);
                _mm256_store_ps(g00 + 8 * 4, _k4);
                _mm256_store_ps(g00 + 8 * 5, _k5);
                _mm256_store_ps(g00 + 8 * 6, _k6);
                _mm256_store_ps(g00 + 8 * 7, _k7);

                g00 += 64;
#else  // __AVX2__
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    g00[4] = k4[0];
                    g00[5] = k5[0];
                    g00[6] = k6[0];
                    g00[7] = k7[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    k4 += maxk;
                    k5 += maxk;
                    k6 += maxk;
                    k7 += maxk;
                    g00 += 8;
                }
#endif // __AVX2__
            }

            kptr0 += maxk * 8;
            kptr1 += maxk * 8;
            kptr2 += maxk * 8;
            kptr3 += maxk * 8;
            kptr4 += maxk * 8;
            kptr5 += maxk * 8;
            kptr6 += maxk * 8;
            kptr7 += maxk * 8;
        }

#if __AVX2__
        _vindex = _mm256_mullo_epi32(_vindex, _mm256_set1_epi32(inch));
#endif // __AVX2__

        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if !__AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;
#endif // !__AVX2__

                for (int i = 0; i < 4; i++)
                {
#if __AVX2__
                    __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                    _mm256_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 8;
#else  // __AVX2__
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    g00[4] = k4[0];
                    g00[5] = k5[0];
                    g00[6] = k6[0];
                    g00[7] = k7[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    k4 += maxk;
                    k5 += maxk;
                    k6 += maxk;
                    k7 += maxk;
                    g00 += 8;
#endif // __AVX2__
                }
            }

            kptr0 += maxk * 4;
#if !__AVX2__
            kptr1 += maxk * 4;
            kptr2 += maxk * 4;
            kptr3 += maxk * 4;
            kptr4 += maxk * 4;
            kptr5 += maxk * 4;
            kptr6 += maxk * 4;
            kptr7 += maxk * 4;
#endif // !__AVX2__
        }
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if !__AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;
#endif // !__AVX2__

                for (int i = 0; i < 2; i++)
                {
#if __AVX2__
                    __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                    _mm256_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 8;
#else  // __AVX2__
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    g00[4] = k4[0];
                    g00[5] = k5[0];
                    g00[6] = k6[0];
                    g00[7] = k7[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    k4 += maxk;
                    k5 += maxk;
                    k6 += maxk;
                    k7 += maxk;
                    g00 += 8;
#endif // __AVX2__
                }
            }

            kptr0 += maxk * 2;
#if !__AVX2__
            kptr1 += maxk * 2;
            kptr2 += maxk * 2;
            kptr3 += maxk * 2;
            kptr4 += maxk * 2;
            kptr5 += maxk * 2;
            kptr6 += maxk * 2;
            kptr7 += maxk * 2;
#endif // !__AVX2__
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                _mm256_store_ps(g00, _k0);
                g00 += 8;
#else  // __AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;

                g00[0] = k0[0];
                g00[1] = k1[0];
                g00[2] = k2[0];
                g00[3] = k3[0];
                g00[4] = k4[0];
                g00[5] = k5[0];
                g00[6] = k6[0];
                g00[7] = k7[0];
                g00 += 8;
#endif // __AVX2__
            }
        }
    }
#endif // __AVX__
    for (; q + 3 < outch; q += 4)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;
        const float* kptr2 = (const float*)kernel + (q + 2) * inch * maxk;
        const float* kptr3 = (const float*)kernel + (q + 3) * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4);
#elif __AVX__
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4);
#else
        float* g00 = kernel_tm.channel(q / 4);
#endif

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(maxk));
        __m256i _vindex_256 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex_256 = _mm256_mullo_epi32(_vindex_256, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __AVX__
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex_512, k1, sizeof(float));
                __m512 _k2 = _mm512_i32gather_ps(_vindex_512, k2, sizeof(float));
                __m512 _k3 = _mm512_i32gather_ps(_vindex_512, k3, sizeof(float));

                transpose16x4_ps(_k0, _k1, _k2, _k3);

                _mm512_storeu_ps(g00, _k0);
                _mm512_storeu_ps(g00 + 16, _k1);
                _mm512_storeu_ps(g00 + 16 * 2, _k2);
                _mm512_storeu_ps(g00 + 16 * 3, _k3);

                g00 += 64;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
            kptr2 += maxk * 16;
            kptr3 += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex_256, sizeof(float));
                __m256 _k1 = _mm256_i32gather_ps(k1, _vindex_256, sizeof(float));
                __m256 _k2 = _mm256_i32gather_ps(k2, _vindex_256, sizeof(float));
                __m256 _k3 = _mm256_i32gather_ps(k3, _vindex_256, sizeof(float));

                transpose8x4_ps(_k0, _k1, _k2, _k3);

                _mm256_storeu_ps(g00, _k0);
                _mm256_storeu_ps(g00 + 8, _k1);
                _mm256_storeu_ps(g00 + 8 * 2, _k2);
                _mm256_storeu_ps(g00 + 8 * 3, _k3);

                g00 += 32;
#else  // __AVX2__
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    g00 += 4;
                }
#endif // __AVX2__
            }

            kptr0 += maxk * 8;
            kptr1 += maxk * 8;
            kptr2 += maxk * 8;
            kptr3 += maxk * 8;
        }
#endif // __AVX__
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                __m128 _k1 = _mm_i32gather_ps(k1, _vindex, sizeof(float));
                __m128 _k2 = _mm_i32gather_ps(k2, _vindex, sizeof(float));
                __m128 _k3 = _mm_i32gather_ps(k3, _vindex, sizeof(float));

                _MM_TRANSPOSE4_PS(_k0, _k1, _k2, _k3);

                _mm_store_ps(g00, _k0);
                _mm_store_ps(g00 + 4, _k1);
                _mm_store_ps(g00 + 4 * 2, _k2);
                _mm_store_ps(g00 + 4 * 3, _k3);

                g00 += 16;
#else  // __AVX2__
                for (int i = 0; i < 4; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    g00 += 4;
                }
#endif // __AVX2__
            }

            kptr0 += maxk * 4;
            kptr1 += maxk * 4;
            kptr2 += maxk * 4;
            kptr3 += maxk * 4;
        }

#if __AVX2__
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(inch));
#endif // __AVX2__

        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if !__AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
#endif // !__AVX2__

                for (int i = 0; i < 2; i++)
                {
#if __AVX2__
                    __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                    _mm_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 4;
#else  // __AVX2__
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    g00 += 4;
#endif // __AVX2__
                }
            }

            kptr0 += maxk * 2;
#if !__AVX2__
            kptr1 += maxk * 2;
            kptr2 += maxk * 2;
            kptr3 += maxk * 2;
#endif // !__AVX2__
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                _mm_store_ps(g00, _k0);
                g00 += 4;
#else  // __AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

                g00[0] = k0[0];
                g00[1] = k1[0];
                g00[2] = k2[0];
                g00[3] = k3[0];
                g00 += 4;
#endif // __AVX2__
            }
        }
    }
#endif // __SSE2__
    for (; q + 1 < outch; q += 2)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4 + (q % 4) / 2);
#elif __AVX__
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4 + (q % 4) / 2);
#elif __SSE2__
        float* g00 = kernel_tm.channel(q / 4 + (q % 4) / 2);
#else
        float* g00 = kernel_tm.channel(q / 2);
#endif

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(maxk));
        __m256i _vindex_256 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex_256 = _mm256_mullo_epi32(_vindex_256, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex_512, k1, sizeof(float));
                _mm512_storeu_ps(g00, _k0);
                _mm512_storeu_ps(g00 + 16, _k1);
                g00 += 32;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex_256, sizeof(float));
                __m256 _k1 = _mm256_i32gather_ps(k1, _vindex_256, sizeof(float));
                _mm256_storeu_ps(g00, _k0);
                _mm256_storeu_ps(g00 + 8, _k1);
                g00 += 16;
#else  // __AVX2__
                g00[0] = k0[0];
                g00[1] = k0[maxk];
                g00[2] = k0[maxk * 2];
                g00[3] = k0[maxk * 3];
                g00[4] = k0[maxk * 4];
                g00[5] = k0[maxk * 5];
                g00[6] = k0[maxk * 6];
                g00[7] = k0[maxk * 7];
                g00[8] = k1[0];
                g00[9] = k1[maxk];
                g00[10] = k1[maxk * 2];
                g00[11] = k1[maxk * 3];
                g00[12] = k1[maxk * 4];
                g00[13] = k1[maxk * 5];
                g00[14] = k1[maxk * 6];
                g00[15] = k1[maxk * 7];
                g00 += 16;
#endif // __AVX2__
            }

            kptr0 += maxk * 8;
            kptr1 += maxk * 8;
        }
#endif // __AVX__
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                __m128 _k1 = _mm_i32gather_ps(k1, _vindex, sizeof(float));
                _mm_storeu_ps(g00, _k0);
                _mm_storeu_ps(g00 + 4, _k1);
                g00 += 8;
#else  // __AVX2__
                g00[0] = k0[0];
                g00[1] = k0[maxk];
                g00[2] = k0[maxk * 2];
                g00[3] = k0[maxk * 3];
                g00[4] = k1[0];
                g00[5] = k1[maxk];
                g00[6] = k1[maxk * 2];
                g00[7] = k1[maxk * 3];
                g00 += 8;
#endif // __AVX2__
            }

            kptr0 += maxk * 4;
            kptr1 += maxk * 4;
        }
#endif // __SSE2__
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

                for (int i = 0; i < 2; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    k0 += maxk;
                    k1 += maxk;
                    g00 += 2;
                }
            }

            kptr0 += maxk * 2;
            kptr1 += maxk * 2;
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

                g00[0] = k0[0];
                g00[1] = k1[0];
                g00 += 2;
            }
        }
    }
    for (; q < outch; q++)
    {
        const float* kptr = (const float*)kernel + q * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4 + (q % 4) / 2 + q % 2);
#elif __AVX__
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4 + (q % 4) / 2 + q % 2);
#elif __SSE2__
        float* g00 = kernel_tm.channel(q / 4 + (q % 4) / 2 + q % 2);
#else
        float* g00 = kernel_tm.channel(q / 2 + q % 2);
#endif

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(maxk));
        __m256i _vindex_256 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex_256 = _mm256_mullo_epi32(_vindex_256, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                _mm512_storeu_ps(g00, _k0);
                g00 += 16;
            }

            kptr += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex_256, sizeof(float));
                _mm256_storeu_ps(g00, _k0);
                g00 += 8;
#else  // __AVX2__
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0[0];
                    k0 += maxk;
                    g00 += 1;
                }
#endif // __AVX2__
            }

            kptr += maxk * 8;
        }
#endif // __AVX__
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                _mm_storeu_ps(g00, _k0);
                g00 += 4;
#else  // __AVX2__
                for (int i = 0; i < 4; i++)
                {
                    g00[0] = k0[0];
                    k0 += maxk;
                    g00 += 1;
                }
#endif // __AVX2__
            }

            kptr += maxk * 4;
        }
#endif // __SSE2__
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

                for (int i = 0; i < 2; i++)
                {
                    g00[0] = k0[0];
                    k0 += maxk;
                    g00 += 1;
                }
            }

            kptr += maxk * 2;
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

                g00[0] = k0[0];
                g00++;
            }
        }
    }
}